

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O2

ssize_t __thiscall Uic::write(Uic *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  FILE *__stream;
  int iVar2;
  DomUI *other;
  ulong uVar3;
  Driver *__n_00;
  undefined8 extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  long in_FS_OFFSET;
  double dVar4;
  QLatin1String QVar5;
  QArrayDataPointer<char> local_60;
  QXmlStreamReader reader;
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (DomUI *)0x0;
  _reader = (Data *)0xaaaaaaaaaaaaaaaa;
  QXmlStreamReader::QXmlStreamReader(&reader);
  QXmlStreamReader::setDevice((QIODevice *)&reader);
  other = parseUiFile(&reader);
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::reset(&local_30,other);
  QXmlStreamReader::~QXmlStreamReader(&reader);
  if (local_30.d != (DomUI *)0x0) {
    _reader = ((local_30.d)->m_attr_version).d.d;
    if (_reader != (Data *)0x0) {
      LOCK();
      (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    dVar4 = (double)QString::toDouble((bool *)&reader);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&reader);
    if (4.0 <= dVar4) {
      _reader = ((local_30.d)->m_attr_language).d.d;
      lVar1 = ((local_30.d)->m_attr_language).d.size;
      if (_reader != (Data *)0x0) {
        LOCK();
        (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      __n_00 = this->drv;
      __buf_00 = (void *)CONCAT71((int7)((ulong)extraout_RDX >> 8),(local_30.d)->m_attr_idbasedtr);
      __n_00->m_idBasedTranslations = (local_30.d)->m_attr_idbasedtr;
      if (lVar1 == 0) {
LAB_0016dd40:
        uVar3 = write(this,(int)local_30.d,__buf_00,(size_t)__n_00);
        uVar3 = uVar3 & 0xffffffff;
      }
      else {
        __n_00 = (Driver *)0x0;
        QVar5.m_data = (char *)0x3;
        QVar5.m_size = (qsizetype)&reader;
        iVar2 = QString::compare(QVar5,0x1773aa);
        __stream = _stderr;
        __buf_00 = extraout_RDX_00;
        if (iVar2 == 0) goto LAB_0016dd40;
        QString::toLocal8Bit((QByteArray *)&local_60,(QString *)&reader);
        if (local_60.ptr == (char *)0x0) {
          local_60.ptr = (char *)&QByteArray::_empty;
        }
        uVar3 = 0;
        fprintf(__stream,"uic: File is not a \"c++\" ui file, language=%s\n",local_60.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&reader);
      goto LAB_0016dd74;
    }
    fwrite("uic: File generated with too old version of Qt Widgets Designer\n",0x40,1,_stderr);
  }
  uVar3 = 0;
LAB_0016dd74:
  QScopedPointerDeleter<DomUI>::cleanup((EVP_PKEY_CTX *)local_30.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

bool Uic::write(QIODevice *in)
{
    QScopedPointer<DomUI> ui;
    {
        QXmlStreamReader reader;
        reader.setDevice(in);
        ui.reset(parseUiFile(reader));
    }

    if (ui.isNull())
        return false;

    double version = ui->attributeVersion().toDouble();
    if (version < 4.0) {
        fprintf(stderr, "uic: File generated with too old version of Qt Widgets Designer\n");
        return false;
    }

    const QString &language = ui->attributeLanguage();
    driver()->setUseIdBasedTranslations(ui->attributeIdbasedtr());

    if (!language.isEmpty() && language.compare("c++"_L1, Qt::CaseInsensitive) != 0) {
        fprintf(stderr, "uic: File is not a \"c++\" ui file, language=%s\n", qPrintable(language));
        return false;
    }

    return write(ui.data());
}